

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O2

void rgb_gray_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                     JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  _func_void_j_compress_ptr *p_Var2;
  JSAMPROW pJVar3;
  byte *pbVar4;
  ulong uVar5;
  
  p_Var2 = cinfo->cconvert[1].start_pass;
  uVar1 = cinfo->image_width;
  while (0 < num_rows) {
    num_rows = num_rows + -1;
    pbVar4 = *input_buf;
    pJVar3 = (*output_buf)[output_row];
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      pJVar3[uVar5] =
           (JSAMPLE)((uint)(*(int *)(p_Var2 + (ulong)pbVar4[1] * 8 + 0x800) +
                            *(int *)(p_Var2 + (ulong)*pbVar4 * 8) +
                           *(int *)(p_Var2 + (ulong)pbVar4[2] * 8 + 0x1000)) >> 0x10);
      pbVar4 = pbVar4 + 3;
    }
    input_buf = input_buf + 1;
    output_row = output_row + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_gray_convert (j_compress_ptr cinfo,
		  JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
		  JDIMENSION output_row, int num_rows)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  register int r, g, b;
  register INT32 * ctab = cconvert->rgb_ycc_tab;
  register JSAMPROW inptr;
  register JSAMPROW outptr;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->image_width;

  while (--num_rows >= 0) {
    inptr = *input_buf++;
    outptr = output_buf[0][output_row];
    output_row++;
    for (col = 0; col < num_cols; col++) {
      r = GETJSAMPLE(inptr[RGB_RED]);
      g = GETJSAMPLE(inptr[RGB_GREEN]);
      b = GETJSAMPLE(inptr[RGB_BLUE]);
      inptr += RGB_PIXELSIZE;
      /* Y */
      outptr[col] = (JSAMPLE)
		((ctab[r+R_Y_OFF] + ctab[g+G_Y_OFF] + ctab[b+B_Y_OFF])
		 >> SCALEBITS);
    }
  }
}